

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_ceiling(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
                 lyxp_set *set,int options)

{
  longdouble lVar1;
  int iVar2;
  int iVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble number;
  
  iVar2 = lyxp_set_cast(*args,LYXP_SET_NUMBER,cur_node,param_4,options);
  iVar3 = -1;
  if (iVar2 == 0) {
    lVar1 = ((*args)->val).num;
    lVar4 = (longdouble)(long)ROUND(lVar1);
    lVar5 = (longdouble)((long)ROUND(lVar1) + 1);
    number = lVar1;
    if (lVar4 != lVar1) {
      number = lVar5;
    }
    if (NAN(lVar4) || NAN(lVar1)) {
      number = lVar5;
    }
    set_fill_number(set,number);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xpath_ceiling(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
              struct lyxp_set *set, int options)
{
    if (lyxp_set_cast(args[0], LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }
    if ((long long)args[0]->val.num != args[0]->val.num) {
        set_fill_number(set, ((long long)args[0]->val.num) + 1);
    } else {
        set_fill_number(set, args[0]->val.num);
    }

    return EXIT_SUCCESS;
}